

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O2

int xmlSchemaFixupSimpleTypeStageTwo(xmlSchemaParserCtxtPtr pctxt,xmlSchemaTypePtr type)

{
  xmlSchemaTypeType xVar1;
  _xmlSchemaTypeLink *p_Var2;
  xmlSchemaFacetPtr item;
  xmlSchemaTypePtr pxVar3;
  _xmlSchemaFacetLink *p_Var4;
  uint uVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  xmlSchemaTypeLinkPtr pxVar9;
  _xmlSchemaTypeLink *p_Var10;
  xmlChar *pxVar11;
  xmlSchemaValidCtxtPtr pxVar12;
  xmlChar *pxVar13;
  xmlNodePtr pxVar14;
  _xmlSchemaFacetLink *p_Var15;
  _xmlSchemaTypeLink *p_Var16;
  xmlChar *pxVar17;
  xmlSchemaTypePtr pxVar18;
  uint uVar19;
  uint uVar20;
  xmlSchemaPtr name;
  xmlNodePtr facet2;
  xmlSchemaFacetLinkPtr pxVar21;
  xmlSchemaFacetLinkPtr pxVar22;
  _xmlSchemaTypeLink *p_Var23;
  xmlSchemaParserCtxtPtr pxVar24;
  xmlNodePtr pxVar25;
  xmlNodePtr pxVar26;
  xmlParserErrors xVar27;
  uint uVar28;
  uint uVar29;
  char *pcVar30;
  _xmlSchemaFacet *p_Var31;
  char *pcVar32;
  bool bVar33;
  xmlSchemaTypeLinkPtr pxVar34;
  xmlNodePtr pxVar35;
  xmlNodePtr item_00;
  xmlSchemaFacetPtr pxVar36;
  xmlNodePtr facet1;
  xmlNodePtr facet2_00;
  xmlNodePtr pxVar37;
  xmlSchemaFacetPtr facet;
  xmlChar **buf;
  _xmlSchemaFacetLink *p_Var38;
  xmlNodePtr pxVar39;
  xmlChar *in_stack_fffffffffffffef8;
  xmlSchemaParserCtxtPtr pxVar40;
  xmlChar *in_stack_ffffffffffffff08;
  xmlSchemaTypePtr pxVar41;
  xmlNodePtr local_d8;
  xmlNodePtr local_d0;
  xmlChar *local_b8;
  xmlChar *des;
  xmlNodePtr local_a8;
  xmlNodePtr local_a0;
  xmlNodePtr local_98;
  xmlNodePtr local_90;
  xmlNodePtr local_88;
  xmlNodePtr local_80;
  xmlChar *local_78;
  xmlNodePtr local_70;
  xmlNodePtr local_68;
  xmlNodePtr local_60;
  xmlNodePtr local_58;
  xmlSchemaFacetLinkPtr local_50;
  xmlSchemaFacetLinkPtr local_48;
  xmlNodePtr local_40;
  int local_34;
  
  if (type->type != XML_SCHEMA_TYPE_SIMPLE) {
    return -1;
  }
  if (((uint)type->flags >> 0x16 & 1) != 0) {
    return 0;
  }
  iVar7 = pctxt->nberrors;
  type->flags = type->flags | 0x400000;
  type->contentType = XML_SCHEMA_CONTENT_SIMPLE;
  pxVar18 = type->baseType;
  if (pxVar18 == (xmlSchemaTypePtr)0x0) {
    pcVar30 = "xmlSchemaFixupSimpleTypeStageTwo";
    pcVar32 = "missing baseType";
LAB_00193f6e:
    xmlSchemaInternalErr((xmlSchemaAbstractCtxtPtr)pctxt,pcVar30,pcVar32);
    return -1;
  }
  local_34 = iVar7;
  if ((pxVar18->type != XML_SCHEMA_TYPE_BASIC) && ((pxVar18->flags & 0x400000) == 0)) {
    xmlSchemaTypeFixup(pxVar18,(xmlSchemaAbstractCtxtPtr)pctxt);
  }
  p_Var16 = type->memberTypes;
  if (p_Var16 != (xmlSchemaTypeLinkPtr)0x0) {
    for (; p_Var16 != (xmlSchemaTypeLinkPtr)0x0; p_Var16 = p_Var16->next) {
      pxVar18 = p_Var16->type;
      pxVar24 = pctxt;
      if ((pxVar18->type != XML_SCHEMA_TYPE_BASIC) && ((pxVar18->flags & 0x400000) == 0)) {
        xmlSchemaTypeFixup(pxVar18,(xmlSchemaAbstractCtxtPtr)pctxt);
        pxVar18 = p_Var16->type;
        pxVar24 = pctxt;
      }
      if (((pxVar18->flags & 0x80) != 0) &&
         (pxVar9 = xmlSchemaGetUnionSimpleTypeMemberTypes(pxVar18),
         pxVar9 != (xmlSchemaTypeLinkPtr)0x0)) {
        p_Var16->type = pxVar9->type;
        p_Var23 = pxVar9->next;
        if (p_Var23 != (_xmlSchemaTypeLink *)0x0) {
          p_Var2 = p_Var16->next;
          pxVar9 = p_Var16;
          for (; p_Var23 != (_xmlSchemaTypeLink *)0x0; p_Var23 = p_Var23->next) {
            p_Var10 = (_xmlSchemaTypeLink *)(*xmlMalloc)(0x10);
            if (p_Var10 == (_xmlSchemaTypeLink *)0x0) goto LAB_001952a7;
            p_Var10->type = p_Var23->type;
            pxVar9->next = p_Var10;
            p_Var10->next = p_Var2;
            pxVar9 = p_Var10;
          }
        }
      }
      pctxt = pxVar24;
    }
  }
  pxVar18 = type->baseType;
  des = (xmlChar *)0x0;
  if (pxVar18 == (xmlSchemaTypePtr)0x0) {
    pcVar32 = "No base type existent";
LAB_00193ff5:
    xVar27 = XML_SCHEMAP_ST_PROPS_CORRECT_1;
LAB_00193ffd:
    xmlSchemaPCustomErr(pctxt,xVar27,(xmlSchemaBasicItemPtr)type,(xmlNodePtr)0x0,pcVar32,
                        (xmlChar *)0x0);
    goto LAB_0019400a;
  }
  xVar1 = pxVar18->type;
  if ((xVar1 == XML_SCHEMA_TYPE_SIMPLE) ||
     ((xVar1 == XML_SCHEMA_TYPE_BASIC && (pxVar18->builtInType != 0x2d)))) {
    uVar8 = type->flags;
    if (((char)((uVar8 & 4) >> 2) == '\0' && (uVar8 & 0xc0) != 0) &&
       ((xVar1 != XML_SCHEMA_TYPE_SIMPLE &&
        ((xVar1 != XML_SCHEMA_TYPE_BASIC || (pxVar18->builtInType != 0x2e)))))) {
      pxVar11 = xmlSchemaGetComponentQName(&des,pxVar18);
      pcVar32 = 
      "A type, derived by list or union, must have the simple ur-type definition as base type, not \'%s\'"
      ;
      goto LAB_00193fc1;
    }
    if ((uVar8 & 0x1c0) == 0) {
      pcVar32 = "The variety is absent";
      goto LAB_00193ff5;
    }
    uVar19 = pxVar18->flags;
    pxVar39 = (xmlNodePtr)(ulong)uVar19;
    if ((uVar19 >> 10 & 1) != 0) {
      buf = &des;
      pxVar11 = xmlSchemaGetComponentQName(buf,pxVar18);
      pcVar32 = "The \'final\' of its base type \'%s\' must not contain \'restriction\'";
      xVar27 = XML_SCHEMAP_ST_PROPS_CORRECT_3;
      goto LAB_00193fcc;
    }
    local_b8 = (xmlChar *)0x0;
    if (type->type != XML_SCHEMA_TYPE_SIMPLE) {
      pcVar30 = "xmlSchemaCheckCOSSTRestricts";
      pcVar32 = "given type is not a user-derived simpleType";
      goto LAB_00193f6e;
    }
    pxVar24 = pctxt;
    pxVar40 = pctxt;
    pxVar41 = type;
    if ((uVar8 >> 8 & 1) != 0) {
      if ((uVar19 >> 8 & 1) != 0) {
        pxVar36 = type->facets;
        if (pxVar36 != (xmlSchemaFacetPtr)0x0) {
          pxVar18 = xmlSchemaGetPrimitiveType(type);
          if (pxVar18 == (xmlSchemaTypePtr)0x0) {
            pcVar32 = "failed to get primitive type";
            goto LAB_001952df;
          }
          bVar33 = false;
          do {
            while (iVar7 = xmlSchemaIsBuiltInTypeFacet(pxVar18,pxVar36->type), iVar7 == 0) {
              des = (xmlChar *)0x0;
              local_78 = (xmlChar *)0x0;
              xmlSchemaFormatItemForReport
                        (&des,(xmlChar *)type,(xmlSchemaBasicItemPtr)type->node,pxVar39);
              local_80 = type->node;
              local_a0 = (xmlNodePtr)des;
              pxVar11 = xmlSchemaFacetTypeToString(pxVar36->type);
              pxVar13 = xmlSchemaFormatItemForReport
                                  (&local_78,(xmlChar *)pxVar18,(xmlSchemaBasicItemPtr)0x0,pxVar39);
              pxVar39 = (xmlNodePtr)0x0;
              xmlSchemaPErrExt(pctxt,local_80,0xbc5,
                               (xmlChar *)
                               "%s: The facet \'%s\' is not allowed on types derived from the type %s.\n"
                               ,(xmlChar *)local_a0,pxVar11,(char *)pxVar13,(xmlChar *)0x0,
                               in_stack_fffffffffffffef8,(xmlChar *)pxVar40,
                               in_stack_ffffffffffffff08,(xmlChar *)pxVar41);
              if (des != (xmlChar *)0x0) {
                (*xmlFree)(des);
                des = (xmlChar *)0x0;
              }
              if (local_78 != (xmlChar *)0x0) {
                (*xmlFree)(local_78);
              }
              pxVar36 = pxVar36->next;
              bVar33 = true;
              if (pxVar36 == (_xmlSchemaFacet *)0x0) goto LAB_0019400a;
            }
            pxVar36 = pxVar36->next;
          } while (pxVar36 != (_xmlSchemaFacet *)0x0);
          if (bVar33) goto LAB_0019400a;
        }
        goto LAB_001942ca;
      }
      buf = &local_b8;
      pxVar11 = xmlSchemaGetComponentQName(buf,pxVar18);
      pcVar32 = "The base type \'%s\' is not an atomic simple type";
      xVar27 = XML_SCHEMAP_COS_ST_RESTRICTS_1_1;
      goto LAB_00193fcc;
    }
    if ((uVar8 & 0x40) == 0) {
      if (-1 < (char)uVar8) goto LAB_001942ca;
      pxVar9 = (xmlSchemaTypeLinkPtr)&type->memberTypes;
      pxVar34 = pxVar9;
      do {
        pxVar34 = pxVar34->next;
        if (pxVar34 == (xmlSchemaTypeLinkPtr)0x0) {
          pxVar18 = type->baseType;
          if (pxVar18->builtInType == 0x2e) goto LAB_001943bd;
          if (-1 < (char)pxVar18->flags) {
            buf = &local_b8;
            pxVar11 = xmlSchemaGetComponentQName(buf,pxVar18);
            pcVar32 = "The base type \'%s\' is not a union type";
            xVar27 = XML_SCHEMAP_COS_ST_RESTRICTS_3_3_2_1;
            goto LAB_00193fcc;
          }
          pctxt = pxVar40;
          if (((uint)pxVar18->flags >> 10 & 1) != 0) {
            pxVar11 = xmlSchemaGetComponentQName(&local_b8,pxVar18);
            pcVar32 = "The \'final\' of its base type \'%s\' must not contain \'restriction\'";
            xVar27 = XML_SCHEMAP_COS_ST_RESTRICTS_3_3_2_2;
            type = pxVar41;
            goto LAB_0019566d;
          }
          pxVar9 = *(xmlSchemaTypeLinkPtr *)pxVar9;
          type = pxVar41;
          if (pxVar9 == (xmlSchemaTypeLinkPtr)0x0) goto LAB_00195677;
          pxVar24 = pxVar40;
          p_Var16 = xmlSchemaGetUnionSimpleTypeMemberTypes(pxVar18);
          goto LAB_00195504;
        }
        pxVar18 = pxVar34->type;
        if ((pxVar18->type != XML_SCHEMA_TYPE_BASIC) && ((pxVar18->flags & 0x400000) == 0)) {
          xmlSchemaTypeFixup(pxVar18,(xmlSchemaAbstractCtxtPtr)pctxt);
          pxVar18 = pxVar34->type;
        }
      } while ((pxVar18->flags & 0x140) != 0);
      buf = &local_b8;
      pxVar11 = xmlSchemaGetComponentQName(buf,pxVar18);
      pcVar32 = "The member type \'%s\' is neither an atomic, nor a list type";
      xVar27 = XML_SCHEMAP_COS_ST_RESTRICTS_3_1;
      goto LAB_00193fcc;
    }
    pxVar18 = type->subtypes;
    pcVar32 = "failed to evaluate the item type";
    if (pxVar18 == (xmlSchemaTypePtr)0x0) {
LAB_001952df:
      pcVar30 = "xmlSchemaCheckCOSSTRestricts";
      goto LAB_001952e6;
    }
    if (pxVar18->type == XML_SCHEMA_TYPE_SIMPLE) {
      if ((pxVar18->flags & 0x400000) == 0) {
        xmlSchemaTypeFixup(pxVar18,(xmlSchemaAbstractCtxtPtr)pctxt);
      }
    }
    else if ((pxVar18->type != XML_SCHEMA_TYPE_BASIC) || (pxVar18->builtInType == 0x2d))
    goto LAB_001952df;
    uVar8 = pxVar18->flags;
    if ((uVar8 & 0x180) != 0) {
      if ((char)uVar8 < '\0') {
        pxVar9 = (xmlSchemaTypeLinkPtr)&pxVar18->memberTypes;
        do {
          pxVar9 = pxVar9->next;
          if (pxVar9 == (xmlSchemaTypeLinkPtr)0x0) goto LAB_00195318;
        } while ((pxVar9->type->flags & 0x100) != 0);
        buf = &local_b8;
        pxVar11 = xmlSchemaGetComponentQName(buf,pxVar9->type);
        pcVar32 = 
        "The item type is a union type, but the member type \'%s\' of this item type is not atomic";
        xVar27 = XML_SCHEMAP_COS_ST_RESTRICTS_2_1;
      }
      else {
LAB_00195318:
        pxVar3 = type->baseType;
        pctxt = pxVar24;
        type = pxVar41;
        if ((pxVar3->type == XML_SCHEMA_TYPE_BASIC) && (pxVar3->builtInType == 0x2e)) {
          if ((uVar8 >> 0xb & 1) != 0) {
            pxVar11 = xmlSchemaGetComponentQName(&local_b8,pxVar18);
            pcVar32 = "The final of its item type \'%s\' must not contain \'list\'";
            xVar27 = XML_SCHEMAP_COS_ST_RESTRICTS_2_3_1_1;
            goto LAB_001953bb;
          }
          for (pxVar36 = pxVar41->facets; pxVar40 = pxVar24, pxVar36 != (xmlSchemaFacetPtr)0x0;
              pxVar36 = pxVar36->next) {
            if (pxVar36->type != XML_SCHEMA_FACET_WHITESPACE) {
              xmlSchemaPIllegalFacetListUnionErr
                        (pxVar24,XML_SCHEMAP_COS_ST_RESTRICTS_2_3_1_2,pxVar41,pxVar36);
              goto LAB_0019400a;
            }
          }
LAB_001942ca:
          pxVar36 = type->facets;
          if (pxVar36 != (xmlSchemaFacetPtr)0x0) {
            iVar7 = pxVar24->nberrors;
            pxVar12 = pxVar24->vctxt;
            if (pxVar12 == (xmlSchemaValidCtxtPtr)0x0) {
              pxVar12 = xmlSchemaNewValidCtxt((xmlSchemaPtr)0x0);
              pxVar24->vctxt = pxVar12;
              if (pxVar12 == (xmlSchemaValidCtxtPtr)0x0) {
                xmlSchemaPErr(pxVar24,(xmlNodePtr)0x0,0xbfd,
                              "Internal error: xmlSchemaCreateVCtxtOnPCtxt, failed to create a temp. validation context.\n"
                              ,(xmlChar *)0x0,(xmlChar *)0x0);
                return -1;
              }
              xmlSchemaSetValidErrors(pxVar12,pxVar24->error,pxVar24->warning,pxVar24->errCtxt);
              xmlSchemaSetValidStructuredErrors(pxVar24->vctxt,pxVar24->serror,pxVar24->errCtxt);
              pxVar12 = pxVar24->vctxt;
            }
            name = pxVar24->schema;
            pxVar12->schema = name;
            for (; pxVar36 != (xmlSchemaFacetPtr)0x0; pxVar36 = pxVar36->next) {
              iVar6 = xmlSchemaCheckFacet(pxVar36,type,pxVar24,(xmlChar *)name);
              if (iVar6 == -1) {
                return -1;
              }
            }
            pxVar24->vctxt->schema = (xmlSchemaPtr)0x0;
            if (iVar7 != pxVar24->nberrors) {
              if (pxVar24->err == -1) {
                return -1;
              }
              pctxt = pxVar24;
              if (pxVar24->err != 0) goto LAB_0019400a;
            }
          }
          local_48 = (xmlSchemaFacetLinkPtr)&type->facetSet;
          p_Var15 = type->facetSet;
          p_Var4 = p_Var15;
          if (p_Var15 == (_xmlSchemaFacetLink *)0x0) {
            if (type->baseType->facetSet != (xmlSchemaFacetLinkPtr)0x0) {
              p_Var38 = (_xmlSchemaFacetLink *)0x0;
              goto LAB_0019440a;
            }
          }
          else {
            do {
              p_Var38 = p_Var4;
              p_Var4 = p_Var38->next;
            } while (p_Var38->next != (_xmlSchemaFacetLink *)0x0);
LAB_0019440a:
            local_80 = (xmlNodePtr)0x0;
            local_60 = (xmlNodePtr)0x0;
            local_70 = (xmlNodePtr)0x0;
            local_90 = (xmlNodePtr)0x0;
            local_a0 = (xmlNodePtr)0x0;
            pxVar35 = (xmlNodePtr)0x0;
            local_98 = (xmlNodePtr)0x0;
            pxVar39 = (xmlNodePtr)0x0;
            facet1 = (xmlNodePtr)0x0;
            for (; p_Var15 != (_xmlSchemaFacetLink *)0x0; p_Var15 = p_Var15->next) {
              pxVar25 = (xmlNodePtr)p_Var15->facet;
              switch(*(xmlSchemaTypeType *)&pxVar25->_private) {
              case XML_SCHEMA_FACET_MININCLUSIVE:
                pxVar35 = pxVar25;
                break;
              case XML_SCHEMA_FACET_MINEXCLUSIVE:
                pxVar39 = pxVar25;
                break;
              case XML_SCHEMA_FACET_MAXINCLUSIVE:
                local_98 = pxVar25;
                break;
              case XML_SCHEMA_FACET_MAXEXCLUSIVE:
                facet1 = pxVar25;
                break;
              case XML_SCHEMA_FACET_TOTALDIGITS:
                local_60 = pxVar25;
                break;
              case XML_SCHEMA_FACET_FRACTIONDIGITS:
                local_70 = pxVar25;
                break;
              case XML_SCHEMA_FACET_LENGTH:
                local_80 = pxVar25;
                break;
              case XML_SCHEMA_FACET_MAXLENGTH:
                local_90 = pxVar25;
                break;
              case XML_SCHEMA_FACET_MINLENGTH:
                local_a0 = pxVar25;
              }
            }
            local_50 = (xmlSchemaFacetLinkPtr)&type->baseType->facetSet;
            local_58 = (xmlNodePtr)0x0;
            local_40 = (xmlNodePtr)0x0;
            local_88 = (xmlNodePtr)0x0;
            local_d8 = (xmlNodePtr)0x0;
            local_d0 = (xmlNodePtr)0x0;
            pxVar22 = local_50;
            pxVar25 = (xmlNodePtr)0x0;
            local_68 = (xmlNodePtr)0x0;
            local_a8 = (xmlNodePtr)0x0;
            facet2_00 = (xmlNodePtr)0x0;
            while (pxVar22 = pxVar22->next, pxVar22 != (xmlSchemaFacetLinkPtr)0x0) {
              pxVar26 = (xmlNodePtr)pxVar22->facet;
              switch(*(xmlSchemaTypeType *)&pxVar26->_private) {
              case XML_SCHEMA_FACET_MININCLUSIVE:
                local_d8 = pxVar26;
                break;
              case XML_SCHEMA_FACET_MINEXCLUSIVE:
                pxVar25 = pxVar26;
                break;
              case XML_SCHEMA_FACET_MAXINCLUSIVE:
                local_d0 = pxVar26;
                break;
              case XML_SCHEMA_FACET_MAXEXCLUSIVE:
                facet2_00 = pxVar26;
                break;
              case XML_SCHEMA_FACET_TOTALDIGITS:
                local_68 = pxVar26;
                break;
              case XML_SCHEMA_FACET_FRACTIONDIGITS:
                local_a8 = pxVar26;
                break;
              case XML_SCHEMA_FACET_LENGTH:
                local_58 = pxVar26;
                break;
              case XML_SCHEMA_FACET_MAXLENGTH:
                local_40 = pxVar26;
                break;
              case XML_SCHEMA_FACET_MINLENGTH:
                local_88 = pxVar26;
              }
            }
            type = pxVar41;
            if ((local_80 != (xmlNodePtr)0x0) &&
               (local_a0 != (xmlNodePtr)0x0 || local_90 != (xmlNodePtr)0x0)) {
              xmlSchemaPCustomErr(pxVar24,XML_SCHEMAP_INVALID_FACET_VALUE,
                                  (xmlSchemaBasicItemPtr)local_80,local_80->parent,
                                  "It is an error for both \'length\' and either of \'minLength\' or \'maxLength\' to be specified on the same type definition"
                                  ,(xmlChar *)0x0);
              type = pxVar41;
            }
            pxVar26 = local_40;
            item_00 = pxVar35;
            if (facet1 != (xmlNodePtr)0x0 && local_98 != (xmlNodePtr)0x0) {
              pxVar37 = local_98->parent;
              pxVar11 = xmlSchemaFacetTypeToString(*(xmlSchemaTypeType *)&local_98->_private);
              pxVar13 = xmlSchemaFacetTypeToString(*(xmlSchemaTypeType *)&facet1->_private);
              item_00 = pxVar35;
              xmlSchemaPCustomErrExt
                        (pxVar24,XML_SCHEMAP_INVALID_FACET_VALUE,(xmlSchemaBasicItemPtr)local_98,
                         pxVar37,
                         "It is an error for both \'%s\' and \'%s\' to be specified on the same type definition"
                         ,pxVar11,pxVar13,(xmlChar *)0x0);
            }
            pxVar37 = local_98;
            if (pxVar39 != (xmlNodePtr)0x0 && pxVar35 != (xmlNodePtr)0x0) {
              pxVar35 = item_00->parent;
              pxVar11 = xmlSchemaFacetTypeToString(*(xmlSchemaTypeType *)&item_00->_private);
              pxVar13 = xmlSchemaFacetTypeToString(*(xmlSchemaTypeType *)&pxVar39->_private);
              xmlSchemaPCustomErrExt
                        (pxVar24,XML_SCHEMAP_INVALID_FACET_VALUE,(xmlSchemaBasicItemPtr)item_00,
                         pxVar35,
                         "It is an error for both \'%s\' and \'%s\' to be specified on the same type definition"
                         ,pxVar11,pxVar13,(xmlChar *)0x0);
            }
            pxVar35 = local_80;
            if ((local_80 != (xmlNodePtr)0x0) && (local_58 != (xmlNodePtr)0x0)) {
              iVar7 = xmlSchemaCompareValues
                                ((xmlSchemaValPtr)local_80->prev,(xmlSchemaValPtr)local_58->prev);
              pxVar14 = local_58;
              if (iVar7 != -2) {
                if ((iVar7 != 0) &&
                   (xmlSchemaDeriveFacetErr
                              (pxVar24,(xmlSchemaFacetPtr)pxVar35,(xmlSchemaFacetPtr)local_58,0,0,1)
                   , pxVar26 = local_40, *(int *)&pxVar14->next != 0)) {
                  xmlSchemaPCustomErr(pxVar24,XML_SCHEMAP_INVALID_FACET_VALUE,
                                      (xmlSchemaBasicItemPtr)pxVar35,pxVar35->parent,
                                      "The base type\'s facet is \'fixed\', thus the value must not differ"
                                      ,(xmlChar *)0x0);
                }
                goto LAB_00194722;
              }
LAB_001952c8:
              pcVar30 = "xmlSchemaDeriveAndValidateFacets";
              pcVar32 = "an error occurred";
LAB_001952e6:
              xmlSchemaInternalErr((xmlSchemaAbstractCtxtPtr)pxVar24,pcVar30,pcVar32);
              return -1;
            }
LAB_00194722:
            if ((local_a0 != (xmlNodePtr)0x0) && (local_88 != (xmlNodePtr)0x0)) {
              iVar7 = xmlSchemaCompareValues
                                ((xmlSchemaValPtr)local_a0->prev,(xmlSchemaValPtr)local_88->prev);
              if (iVar7 == -2) goto LAB_001952c8;
              if (iVar7 != 0) {
                if (iVar7 == -1) {
                  xmlSchemaDeriveFacetErr
                            (pxVar24,(xmlSchemaFacetPtr)local_a0,(xmlSchemaFacetPtr)local_88,1,1,1);
                }
                if (*(int *)&local_88->next != 0) {
                  xmlSchemaPCustomErr(pxVar24,XML_SCHEMAP_INVALID_FACET_VALUE,
                                      (xmlSchemaBasicItemPtr)local_a0,local_a0->parent,
                                      "The base type\'s facet is \'fixed\', thus the value must not differ"
                                      ,(xmlChar *)0x0);
                }
              }
            }
            if ((local_90 != (xmlNodePtr)0x0) && (pxVar26 != (xmlNodePtr)0x0)) {
              iVar7 = xmlSchemaCompareValues
                                ((xmlSchemaValPtr)local_90->prev,(xmlSchemaValPtr)pxVar26->prev);
              if (iVar7 == -2) goto LAB_001952c8;
              if (iVar7 != 0) {
                if (iVar7 == 1) {
                  xmlSchemaDeriveFacetErr
                            (pxVar24,(xmlSchemaFacetPtr)local_90,(xmlSchemaFacetPtr)pxVar26,-1,1,1);
                }
                if (*(int *)&pxVar26->next != 0) {
                  xmlSchemaPCustomErr(pxVar24,XML_SCHEMAP_INVALID_FACET_VALUE,
                                      (xmlSchemaBasicItemPtr)local_90,local_90->parent,
                                      "The base type\'s facet is \'fixed\', thus the value must not differ"
                                      ,(xmlChar *)0x0);
                }
              }
            }
            pxVar14 = local_58;
            if (pxVar35 != (xmlNodePtr)0x0) {
              pxVar14 = pxVar35;
            }
            pxVar35 = item_00;
            if (pxVar14 != (xmlNodePtr)0x0) {
              facet2 = local_88;
              if (local_a0 != (xmlNodePtr)0x0) {
                facet2 = local_a0;
              }
              if (facet2 != (xmlNodePtr)0x0) {
                iVar7 = xmlSchemaCompareValues
                                  ((xmlSchemaValPtr)pxVar14->prev,(xmlSchemaValPtr)facet2->prev);
                if (iVar7 == -2) goto LAB_001952c8;
                pxVar35 = item_00;
                if (iVar7 == -1) {
                  xmlSchemaDeriveFacetErr
                            (pxVar24,(xmlSchemaFacetPtr)pxVar14,(xmlSchemaFacetPtr)facet2,1,1,0);
                }
              }
              if (local_90 != (xmlNodePtr)0x0) {
                pxVar26 = local_90;
              }
              if (pxVar26 != (xmlNodePtr)0x0) {
                item_00 = pxVar35;
                iVar7 = xmlSchemaCompareValues
                                  ((xmlSchemaValPtr)pxVar14->prev,(xmlSchemaValPtr)pxVar26->prev);
                if (iVar7 == -2) goto LAB_001952c8;
                pxVar35 = item_00;
                if (iVar7 == 1) {
                  xmlSchemaDeriveFacetErr
                            (pxVar24,(xmlSchemaFacetPtr)pxVar14,(xmlSchemaFacetPtr)pxVar26,-1,1,0);
                }
              }
            }
            if (pxVar37 != (xmlNodePtr)0x0) {
              if (item_00 != (xmlNodePtr)0x0) {
                iVar7 = xmlSchemaCompareValues
                                  ((xmlSchemaValPtr)pxVar37->prev,(xmlSchemaValPtr)item_00->prev);
                if (iVar7 == -2) goto LAB_001952c8;
                if (iVar7 == -1) {
                  xmlSchemaDeriveFacetErr
                            (pxVar24,(xmlSchemaFacetPtr)pxVar37,(xmlSchemaFacetPtr)pxVar35,1,1,0);
                }
              }
              item_00 = pxVar35;
              if (local_d0 != (xmlNodePtr)0x0) {
                iVar7 = xmlSchemaCompareValues
                                  ((xmlSchemaValPtr)pxVar37->prev,(xmlSchemaValPtr)local_d0->prev);
                if (iVar7 == -2) goto LAB_001952c8;
                if (iVar7 != 0) {
                  pxVar24 = pxVar40;
                  if (iVar7 == 1) {
                    xmlSchemaDeriveFacetErr
                              (pxVar40,(xmlSchemaFacetPtr)local_98,(xmlSchemaFacetPtr)local_d0,-1,1,
                               1);
                    pxVar24 = pxVar40;
                  }
                  pxVar37 = local_98;
                  pxVar40 = pxVar24;
                  if (*(int *)&local_d0->next != 0) {
                    xmlSchemaPCustomErr(pxVar24,XML_SCHEMAP_INVALID_FACET_VALUE,
                                        (xmlSchemaBasicItemPtr)local_98,local_98->parent,
                                        "The base type\'s facet is \'fixed\', thus the value must not differ"
                                        ,(xmlChar *)0x0);
                  }
                }
              }
              if (facet2_00 != (xmlNodePtr)0x0) {
                iVar7 = xmlSchemaCompareValues
                                  ((xmlSchemaValPtr)pxVar37->prev,(xmlSchemaValPtr)facet2_00->prev);
                if (iVar7 == -2) goto LAB_001952c8;
                if (iVar7 != -1) {
                  xmlSchemaDeriveFacetErr
                            (pxVar24,(xmlSchemaFacetPtr)pxVar37,(xmlSchemaFacetPtr)facet2_00,-1,0,1)
                  ;
                }
              }
              if (local_d8 != (xmlNodePtr)0x0) {
                iVar7 = xmlSchemaCompareValues
                                  ((xmlSchemaValPtr)pxVar37->prev,(xmlSchemaValPtr)local_d8->prev);
                if (iVar7 == -2) goto LAB_001952c8;
                if (iVar7 == -1) {
                  xmlSchemaDeriveFacetErr
                            (pxVar24,(xmlSchemaFacetPtr)pxVar37,(xmlSchemaFacetPtr)local_d8,1,1,1);
                }
              }
              pxVar35 = item_00;
              if (pxVar25 != (xmlNodePtr)0x0) {
                iVar7 = xmlSchemaCompareValues
                                  ((xmlSchemaValPtr)pxVar37->prev,(xmlSchemaValPtr)pxVar25->prev);
                if (iVar7 == -2) goto LAB_001952c8;
                pxVar35 = item_00;
                if (iVar7 != 1) {
                  xmlSchemaDeriveFacetErr
                            (pxVar24,(xmlSchemaFacetPtr)pxVar37,(xmlSchemaFacetPtr)pxVar25,1,0,1);
                }
              }
            }
            if (facet1 != (xmlNodePtr)0x0) {
              item_00 = pxVar35;
              if (pxVar39 != (xmlNodePtr)0x0) {
                iVar7 = xmlSchemaCompareValues
                                  ((xmlSchemaValPtr)facet1->prev,(xmlSchemaValPtr)pxVar39->prev);
                if (iVar7 == -2) goto LAB_001952c8;
                item_00 = pxVar35;
                if (iVar7 == -1) {
                  xmlSchemaDeriveFacetErr
                            (pxVar24,(xmlSchemaFacetPtr)facet1,(xmlSchemaFacetPtr)pxVar39,1,1,0);
                  item_00 = pxVar35;
                }
              }
              if (facet2_00 != (xmlNodePtr)0x0) {
                iVar7 = xmlSchemaCompareValues
                                  ((xmlSchemaValPtr)facet1->prev,(xmlSchemaValPtr)facet2_00->prev);
                if (iVar7 == -2) goto LAB_001952c8;
                if (iVar7 != 0) {
                  if (iVar7 == 1) {
                    xmlSchemaDeriveFacetErr
                              (pxVar40,(xmlSchemaFacetPtr)facet1,(xmlSchemaFacetPtr)facet2_00,-1,1,1
                              );
                  }
                  if (*(int *)&facet2_00->next != 0) {
                    xmlSchemaPCustomErr(pxVar40,XML_SCHEMAP_INVALID_FACET_VALUE,
                                        (xmlSchemaBasicItemPtr)facet1,facet1->parent,
                                        "The base type\'s facet is \'fixed\', thus the value must not differ"
                                        ,(xmlChar *)0x0);
                  }
                }
              }
              pxVar24 = pxVar40;
              if (local_d0 != (xmlNodePtr)0x0) {
                iVar7 = xmlSchemaCompareValues
                                  ((xmlSchemaValPtr)facet1->prev,(xmlSchemaValPtr)local_d0->prev);
                if (iVar7 == -2) goto LAB_001952c8;
                if (iVar7 == 1) {
                  xmlSchemaDeriveFacetErr
                            (pxVar24,(xmlSchemaFacetPtr)facet1,(xmlSchemaFacetPtr)local_d0,-1,1,1);
                }
              }
              if (local_d8 != (xmlNodePtr)0x0) {
                iVar7 = xmlSchemaCompareValues
                                  ((xmlSchemaValPtr)facet1->prev,(xmlSchemaValPtr)local_d8->prev);
                if (iVar7 == -2) goto LAB_001952c8;
                if (iVar7 != 1) {
                  xmlSchemaDeriveFacetErr
                            (pxVar24,(xmlSchemaFacetPtr)facet1,(xmlSchemaFacetPtr)local_d8,1,0,1);
                }
              }
              pxVar40 = pxVar24;
              pxVar35 = item_00;
              if (pxVar25 != (xmlNodePtr)0x0) {
                iVar7 = xmlSchemaCompareValues
                                  ((xmlSchemaValPtr)facet1->prev,(xmlSchemaValPtr)pxVar25->prev);
                if (iVar7 == -2) goto LAB_001952c8;
                if (iVar7 != 1) {
                  xmlSchemaDeriveFacetErr
                            (pxVar24,(xmlSchemaFacetPtr)facet1,(xmlSchemaFacetPtr)pxVar25,1,0,1);
                }
              }
            }
            pxVar24 = pxVar40;
            if (pxVar39 != (xmlNodePtr)0x0) {
              item_00 = pxVar35;
              if (local_98 != (xmlNodePtr)0x0) {
                iVar7 = xmlSchemaCompareValues
                                  ((xmlSchemaValPtr)pxVar39->prev,(xmlSchemaValPtr)local_98->prev);
                if (iVar7 == -2) goto LAB_001952c8;
                item_00 = pxVar35;
                if (iVar7 != -1) {
                  xmlSchemaDeriveFacetErr
                            (pxVar24,(xmlSchemaFacetPtr)pxVar39,(xmlSchemaFacetPtr)local_98,-1,0,0);
                  item_00 = pxVar35;
                }
              }
              if (pxVar25 != (xmlNodePtr)0x0) {
                iVar7 = xmlSchemaCompareValues
                                  ((xmlSchemaValPtr)pxVar39->prev,(xmlSchemaValPtr)pxVar25->prev);
                if (iVar7 == -2) goto LAB_001952c8;
                if (iVar7 != 0) {
                  if (iVar7 == -1) {
                    xmlSchemaDeriveFacetErr
                              (pxVar24,(xmlSchemaFacetPtr)pxVar39,(xmlSchemaFacetPtr)pxVar25,1,1,1);
                  }
                  if (*(int *)&pxVar25->next != 0) {
                    xmlSchemaPCustomErr(pxVar24,XML_SCHEMAP_INVALID_FACET_VALUE,
                                        (xmlSchemaBasicItemPtr)pxVar39,pxVar39->parent,
                                        "The base type\'s facet is \'fixed\', thus the value must not differ"
                                        ,(xmlChar *)0x0);
                  }
                }
              }
              if (local_d0 != (xmlNodePtr)0x0) {
                iVar7 = xmlSchemaCompareValues
                                  ((xmlSchemaValPtr)pxVar39->prev,(xmlSchemaValPtr)local_d0->prev);
                if (iVar7 == -2) goto LAB_001952c8;
                if (iVar7 == 1) {
                  xmlSchemaDeriveFacetErr
                            (pxVar24,(xmlSchemaFacetPtr)pxVar39,(xmlSchemaFacetPtr)local_d0,-1,1,1);
                }
              }
              if (local_d8 != (xmlNodePtr)0x0) {
                iVar7 = xmlSchemaCompareValues
                                  ((xmlSchemaValPtr)pxVar39->prev,(xmlSchemaValPtr)local_d8->prev);
                if (iVar7 == -2) goto LAB_001952c8;
                if (iVar7 == -1) {
                  xmlSchemaDeriveFacetErr
                            (pxVar24,(xmlSchemaFacetPtr)pxVar39,(xmlSchemaFacetPtr)local_d8,1,1,1);
                }
              }
              pxVar35 = item_00;
              if (facet2_00 != (xmlNodePtr)0x0) {
                iVar7 = xmlSchemaCompareValues
                                  ((xmlSchemaValPtr)pxVar39->prev,(xmlSchemaValPtr)facet2_00->prev);
                if (iVar7 == -2) goto LAB_001952c8;
                if (iVar7 != -1) {
                  xmlSchemaDeriveFacetErr
                            (pxVar24,(xmlSchemaFacetPtr)pxVar39,(xmlSchemaFacetPtr)facet2_00,-1,0,1)
                  ;
                }
              }
            }
            if (item_00 != (xmlNodePtr)0x0) {
              if (facet1 != (xmlNodePtr)0x0) {
                iVar7 = xmlSchemaCompareValues
                                  ((xmlSchemaValPtr)pxVar35->prev,(xmlSchemaValPtr)facet1->prev);
                if (iVar7 == -2) goto LAB_001952c8;
                if (iVar7 != -1) {
                  xmlSchemaDeriveFacetErr
                            (pxVar24,(xmlSchemaFacetPtr)pxVar35,(xmlSchemaFacetPtr)facet1,-1,0,0);
                }
              }
              if (local_d8 != (xmlNodePtr)0x0) {
                iVar7 = xmlSchemaCompareValues
                                  ((xmlSchemaValPtr)pxVar35->prev,(xmlSchemaValPtr)local_d8->prev);
                if (iVar7 == -2) goto LAB_001952c8;
                if (iVar7 != 0) {
                  if (iVar7 == -1) {
                    xmlSchemaDeriveFacetErr
                              (pxVar24,(xmlSchemaFacetPtr)pxVar35,(xmlSchemaFacetPtr)local_d8,1,1,1)
                    ;
                  }
                  if (*(int *)&local_d8->next != 0) {
                    xmlSchemaPCustomErr(pxVar24,XML_SCHEMAP_INVALID_FACET_VALUE,
                                        (xmlSchemaBasicItemPtr)pxVar35,pxVar35->parent,
                                        "The base type\'s facet is \'fixed\', thus the value must not differ"
                                        ,(xmlChar *)0x0);
                  }
                }
              }
              if (local_d0 != (xmlNodePtr)0x0) {
                iVar7 = xmlSchemaCompareValues
                                  ((xmlSchemaValPtr)pxVar35->prev,(xmlSchemaValPtr)local_d0->prev);
                if (iVar7 == -2) goto LAB_001952c8;
                if (iVar7 == 1) {
                  xmlSchemaDeriveFacetErr
                            (pxVar24,(xmlSchemaFacetPtr)pxVar35,(xmlSchemaFacetPtr)local_d0,-1,1,1);
                }
              }
              if (pxVar25 != (xmlNodePtr)0x0) {
                iVar7 = xmlSchemaCompareValues
                                  ((xmlSchemaValPtr)pxVar35->prev,(xmlSchemaValPtr)pxVar25->prev);
                if (iVar7 == -2) goto LAB_001952c8;
                if (iVar7 != 1) {
                  xmlSchemaDeriveFacetErr
                            (pxVar24,(xmlSchemaFacetPtr)pxVar35,(xmlSchemaFacetPtr)pxVar25,1,0,1);
                }
              }
              if (facet2_00 != (xmlNodePtr)0x0) {
                iVar7 = xmlSchemaCompareValues
                                  ((xmlSchemaValPtr)pxVar35->prev,(xmlSchemaValPtr)facet2_00->prev);
                if (iVar7 == -2) goto LAB_001952c8;
                if (iVar7 != -1) {
                  xmlSchemaDeriveFacetErr
                            (pxVar24,(xmlSchemaFacetPtr)pxVar35,(xmlSchemaFacetPtr)facet2_00,-1,0,1)
                  ;
                }
              }
            }
            if ((local_60 != (xmlNodePtr)0x0) && (local_68 != (xmlNodePtr)0x0)) {
              iVar7 = xmlSchemaCompareValues
                                ((xmlSchemaValPtr)local_60->prev,(xmlSchemaValPtr)local_68->prev);
              if (iVar7 == -2) goto LAB_001952c8;
              if (iVar7 != 0) {
                if (iVar7 == 1) {
                  xmlSchemaDeriveFacetErr
                            (pxVar24,(xmlSchemaFacetPtr)local_60,(xmlSchemaFacetPtr)local_68,-1,1,1)
                  ;
                }
                if (*(int *)&local_68->next != 0) {
                  xmlSchemaPCustomErr(pxVar24,XML_SCHEMAP_INVALID_FACET_VALUE,
                                      (xmlSchemaBasicItemPtr)local_60,local_60->parent,
                                      "The base type\'s facet is \'fixed\', thus the value must not differ"
                                      ,(xmlChar *)0x0);
                }
              }
            }
            if ((local_70 != (xmlNodePtr)0x0) && (local_a8 != (xmlNodePtr)0x0)) {
              iVar7 = xmlSchemaCompareValues
                                ((xmlSchemaValPtr)local_70->prev,(xmlSchemaValPtr)local_a8->prev);
              if (iVar7 == -2) goto LAB_001952c8;
              if (iVar7 != 0) {
                if (iVar7 == 1) {
                  xmlSchemaDeriveFacetErr
                            (pxVar24,(xmlSchemaFacetPtr)local_70,(xmlSchemaFacetPtr)local_a8,-1,1,1)
                  ;
                }
                if (*(int *)&local_a8->next != 0) {
                  xmlSchemaPCustomErr(pxVar24,XML_SCHEMAP_INVALID_FACET_VALUE,
                                      (xmlSchemaBasicItemPtr)local_70,local_70->parent,
                                      "The base type\'s facet is \'fixed\', thus the value must not differ"
                                      ,(xmlChar *)0x0);
                }
              }
            }
            pxVar39 = local_68;
            if (local_60 != (xmlNodePtr)0x0) {
              pxVar39 = local_60;
            }
            if (local_70 != (xmlNodePtr)0x0) {
              local_a8 = local_70;
            }
            pxVar22 = local_50;
            pxVar41 = type;
            if ((pxVar39 != (xmlNodePtr)0x0) && (local_a8 != (xmlNodePtr)0x0)) {
              iVar7 = xmlSchemaCompareValues
                                ((xmlSchemaValPtr)local_a8->prev,(xmlSchemaValPtr)pxVar39->prev);
              if (iVar7 == -2) goto LAB_001952c8;
              pxVar22 = local_50;
              pxVar41 = type;
              if (iVar7 == 1) {
                xmlSchemaDeriveFacetErr
                          (pxVar24,(xmlSchemaFacetPtr)local_a8,(xmlSchemaFacetPtr)pxVar39,-1,1,0);
                pxVar22 = local_50;
                pxVar41 = type;
              }
            }
LAB_00195197:
            pxVar22 = pxVar22->next;
            pxVar40 = pxVar24;
            if (pxVar22 != (xmlSchemaFacetLinkPtr)0x0) {
              pxVar36 = pxVar22->facet;
              xVar1 = pxVar36->type;
              pxVar21 = local_48;
              if ((xVar1 & ~XML_SCHEMA_TYPE_BASIC) != XML_SCHEMA_FACET_PATTERN) {
                do {
                  pxVar21 = pxVar21->next;
                  if (pxVar21 == (xmlSchemaFacetLinkPtr)0x0) {
                    type = pxVar41;
                    local_50 = pxVar22;
                    p_Var15 = (_xmlSchemaFacetLink *)(*xmlMalloc)(0x10);
                    if (p_Var15 == (_xmlSchemaFacetLink *)0x0) {
LAB_001952a7:
                      xmlSchemaPErrMemory(pxVar24);
                      return -1;
                    }
                    p_Var15->facet = local_50->facet;
                    p_Var15->next = (_xmlSchemaFacetLink *)0x0;
                    pxVar22 = local_50;
                    pxVar41 = type;
                    if (p_Var38 == (_xmlSchemaFacetLink *)0x0) {
                      local_48->next = p_Var15;
                      p_Var38 = p_Var15;
                    }
                    else {
                      p_Var38->next = p_Var15;
                      p_Var38 = p_Var15;
                    }
                    goto LAB_00195197;
                  }
                  item = pxVar21->facet;
                } while (item->type != xVar1);
                if (xVar1 == XML_SCHEMA_FACET_WHITESPACE) {
                  type = pxVar41;
                  if (item->whitespace < pxVar36->whitespace) {
                    xmlSchemaPCustomErr(pxVar24,XML_SCHEMAP_INVALID_FACET_VALUE,
                                        (xmlSchemaBasicItemPtr)item,item->node,
                                        "The \'whitespace\' value has to be equal to or stronger than the \'whitespace\' value of the base type"
                                        ,(xmlChar *)0x0);
                    type = pxVar41;
                  }
                  pxVar41 = type;
                  if ((pxVar36->fixed != 0) && (item->whitespace != pxVar36->whitespace)) {
                    xmlSchemaPCustomErr(pxVar24,XML_SCHEMAP_INVALID_FACET_VALUE,
                                        (xmlSchemaBasicItemPtr)item,item->node,
                                        "The base type\'s facet is \'fixed\', thus the value must not differ"
                                        ,(xmlChar *)0x0);
                  }
                }
              }
              goto LAB_00195197;
            }
          }
          uVar8 = type->flags;
          uVar19 = 0x4000000;
          if ((uVar8 & 0x40) != 0) goto LAB_001958b7;
          if (-1 < (char)uVar8) {
            pxVar22 = local_48->next;
            pxVar18 = pxVar41;
            if (pxVar22 != (xmlSchemaFacetLinkPtr)0x0) {
              for (; pxVar22 != (xmlSchemaFacetLinkPtr)0x0; pxVar22 = pxVar22->next) {
                if (pxVar22->facet->type == XML_SCHEMA_FACET_WHITESPACE) {
                  uVar19 = pxVar22->facet->whitespace - 1;
                  if (2 < uVar19) {
                    return -1;
                  }
                  uVar19 = *(uint *)(&DAT_001d1f5c + (ulong)uVar19 * 4);
                  goto LAB_001958b7;
                }
              }
            }
            do {
              pxVar18 = pxVar18->baseType;
              if ((pxVar18 == (xmlSchemaTypePtr)0x0) ||
                 (iVar7 = pxVar18->builtInType, iVar7 == 0x2d)) goto LAB_001958c1;
            } while (pxVar18->type != XML_SCHEMA_TYPE_BASIC);
            if (iVar7 == 0x2e) {
LAB_0019573e:
              uVar19 = 0x1000000;
            }
            else if (iVar7 == 2) {
              uVar19 = 0x2000000;
            }
            else if (iVar7 == 1) goto LAB_0019573e;
LAB_001958b7:
            uVar8 = uVar8 | uVar19;
            pxVar41->flags = uVar8;
          }
LAB_001958c1:
          p_Var31 = pxVar41->facets;
          uVar19 = pxVar41->baseType->flags;
          uVar28 = uVar19 >> 0x1b;
          uVar29 = uVar28 & 1;
          uVar20 = uVar19 >> 0x15 & uVar28 & 1;
          uVar19 = uVar19 >> 0x1c & uVar28 & 1;
          if (p_Var31 != (xmlSchemaFacetPtr)0x0) {
            for (; p_Var31 != (xmlSchemaFacetPtr)0x0; p_Var31 = p_Var31->next) {
              xVar1 = p_Var31->type;
              uVar28 = uVar20;
              uVar5 = uVar19;
              if (((xVar1 != XML_SCHEMA_FACET_WHITESPACE) &&
                  (uVar29 = 1, uVar28 = uVar29, uVar5 = uVar29,
                  xVar1 != XML_SCHEMA_FACET_ENUMERATION)) &&
                 (uVar28 = uVar20, xVar1 != XML_SCHEMA_FACET_PATTERN)) {
                uVar5 = uVar19;
              }
              uVar19 = uVar5;
              uVar20 = uVar28;
            }
          }
          uVar28 = uVar8 | 0x10000000;
          if (uVar19 == 0) {
            uVar28 = uVar8;
          }
          uVar8 = uVar28 | 0x200000;
          if (uVar20 == 0) {
            uVar8 = uVar28;
          }
          if (uVar19 != 0 || uVar20 != 0) {
            pxVar41->flags = uVar8;
          }
          pctxt = pxVar40;
          if (((uVar29 != 0) && (pxVar41->flags = uVar8 | 0x8000000, uVar20 == 0)) &&
             ((uVar8 & 0x100) != 0)) {
            pxVar18 = xmlSchemaGetPrimitiveType(pxVar41);
            if ((pxVar18->builtInType != 1) && (pxVar18->builtInType != 0x2e)) {
              pxVar41->flags = uVar8 | 0x8200000;
            }
          }
          goto LAB_0019400a;
        }
        if ((pxVar3->flags & 0x40U) == 0) {
          pxVar11 = xmlSchemaGetComponentQName(&local_b8,pxVar3);
          pcVar32 = "The base type \'%s\' must be a list type";
          xVar27 = XML_SCHEMAP_COS_ST_RESTRICTS_2_3_2_1;
          type = pxVar41;
        }
        else {
          if (((uint)pxVar3->flags >> 10 & 1) == 0) {
            pxVar3 = pxVar3->subtypes;
            pcVar32 = "failed to eval the item type of a base type";
            if ((pxVar3 == (xmlSchemaTypePtr)0x0) ||
               ((pxVar3->type != XML_SCHEMA_TYPE_SIMPLE &&
                ((pxVar3->type != XML_SCHEMA_TYPE_BASIC || (pxVar3->builtInType == 0x2d))))))
            goto LAB_001952df;
            if ((pxVar18 != pxVar3) &&
               (iVar7 = xmlSchemaCheckCOSSTDerivedOK
                                  ((xmlSchemaAbstractCtxtPtr)pxVar24,pxVar18,pxVar3,0),
               pctxt = pxVar24, type = pxVar41, iVar7 != 0)) {
              des = (xmlChar *)0x0;
              local_78 = (xmlChar *)0x0;
              pxVar11 = xmlSchemaGetComponentQName(&local_b8,pxVar18);
              pxVar13 = xmlSchemaGetComponentQName(&des,pxVar3);
              pxVar17 = xmlSchemaGetComponentQName(&local_78,pxVar41->baseType);
              xmlSchemaPCustomErrExt
                        (pxVar24,XML_SCHEMAP_COS_ST_RESTRICTS_2_3_2_3,(xmlSchemaBasicItemPtr)pxVar41
                         ,(xmlNodePtr)0x0,
                         "The item type \'%s\' is not validly derived from the item type \'%s\' of the base type \'%s\'"
                         ,pxVar11,pxVar13,pxVar17);
LAB_001957fb:
              pctxt = pxVar24;
              if (local_b8 != (xmlChar *)0x0) {
                (*xmlFree)(local_b8);
                pctxt = pxVar24;
              }
              if (des != (xmlChar *)0x0) {
                (*xmlFree)(des);
              }
              if (local_78 != (xmlChar *)0x0) {
                (*xmlFree)(local_78);
              }
              goto LAB_0019400a;
            }
            pxVar36 = type->facets;
            pxVar24 = pctxt;
            pxVar40 = pctxt;
            pxVar41 = type;
            if (pxVar36 != (xmlSchemaFacetPtr)0x0) {
              bVar33 = false;
              do {
                while (pxVar36->type - XML_SCHEMA_FACET_PATTERN < 6) {
                  pxVar36 = pxVar36->next;
                  if (pxVar36 == (_xmlSchemaFacet *)0x0) goto LAB_0019589b;
                }
                xmlSchemaPIllegalFacetListUnionErr
                          (pctxt,XML_SCHEMAP_COS_ST_RESTRICTS_2_3_2_4,type,pxVar36);
                pxVar36 = pxVar36->next;
                bVar33 = true;
              } while (pxVar36 != (_xmlSchemaFacet *)0x0);
              goto LAB_0019400a;
            }
            goto LAB_001942ca;
          }
          pxVar11 = xmlSchemaGetComponentQName(&local_b8,pxVar3);
          pcVar32 = "The \'final\' of the base type \'%s\' must not contain \'restriction\'";
          xVar27 = XML_SCHEMAP_COS_ST_RESTRICTS_2_3_2_2;
          type = pxVar41;
        }
LAB_0019566d:
        buf = &local_b8;
      }
      goto LAB_00193fcc;
    }
    pxVar11 = xmlSchemaGetComponentQName(&local_b8,pxVar18);
    pcVar32 = "The item type \'%s\' does not have a variety of atomic or union";
    xVar27 = XML_SCHEMAP_COS_ST_RESTRICTS_2_1;
LAB_001953bb:
    xmlSchemaPCustomErr(pctxt,xVar27,(xmlSchemaBasicItemPtr)type,(xmlNodePtr)0x0,pcVar32,pxVar11);
    pxVar11 = local_b8;
  }
  else {
    pxVar11 = xmlSchemaGetComponentQName(&des,pxVar18);
    pcVar32 = "The base type \'%s\' is not a simple type";
LAB_00193fc1:
    buf = &des;
    xVar27 = XML_SCHEMAP_ST_PROPS_CORRECT_1;
LAB_00193fcc:
    xmlSchemaPCustomErr(pctxt,xVar27,(xmlSchemaBasicItemPtr)type,(xmlNodePtr)0x0,pcVar32,pxVar11);
    pxVar11 = *buf;
  }
  if (pxVar11 != (xmlChar *)0x0) {
    (*xmlFree)(pxVar11);
  }
LAB_0019400a:
  iVar7 = 0;
  if (local_34 != pctxt->nberrors) {
    iVar7 = pctxt->err;
  }
  return iVar7;
  while ((pxVar18 = pxVar9->type, pxVar18 == (xmlSchemaTypePtr)0x0 ||
         ((pxVar18->flags & 0x1000) == 0))) {
LAB_001943bd:
    pxVar9 = pxVar9->next;
    if (pxVar9 == (xmlSchemaTypeLinkPtr)0x0) {
      if (type->facetSet == (xmlSchemaFacetLinkPtr)0x0) goto LAB_001942ca;
      pcVar32 = "No facets allowed";
      xVar27 = XML_SCHEMAP_COS_ST_RESTRICTS_3_3_1_2;
      goto LAB_00193ffd;
    }
  }
  buf = &local_b8;
  pxVar11 = xmlSchemaGetComponentQName(buf,pxVar18);
  pcVar32 = "The \'final\' of member type \'%s\' contains \'union\'";
  xVar27 = XML_SCHEMAP_COS_ST_RESTRICTS_3_3_1;
  goto LAB_00193fcc;
LAB_00195504:
  pctxt = pxVar24;
  type = pxVar41;
  if (pxVar9 == (xmlSchemaTypeLinkPtr)0x0) goto LAB_00195677;
  if (p_Var16 == (xmlSchemaTypeLinkPtr)0x0) {
    xmlSchemaInternalErr
              ((xmlSchemaAbstractCtxtPtr)pxVar40,"xmlSchemaCheckCOSSTRestricts",
               "different number of member types in base");
    p_Var16 = (_xmlSchemaTypeLink *)0x0;
  }
  else {
    if ((pxVar9->type != p_Var16->type) &&
       (iVar7 = xmlSchemaCheckCOSSTDerivedOK
                          ((xmlSchemaAbstractCtxtPtr)pxVar40,pxVar9->type,p_Var16->type,0),
       iVar7 != 0)) {
      des = (xmlChar *)0x0;
      local_78 = (xmlChar *)0x0;
      pxVar11 = xmlSchemaGetComponentQName(&local_b8,pxVar9->type);
      pxVar13 = xmlSchemaGetComponentQName(&des,p_Var16->type);
      pxVar17 = xmlSchemaGetComponentQName(&local_78,pxVar41->baseType);
      xmlSchemaPCustomErrExt
                (pxVar40,XML_SCHEMAP_COS_ST_RESTRICTS_3_3_2_3,(xmlSchemaBasicItemPtr)pxVar41,
                 (xmlNodePtr)0x0,
                 "The member type %s is not validly derived from its corresponding member type %s of the base type %s"
                 ,pxVar11,pxVar13,pxVar17);
      goto LAB_001957fb;
    }
    p_Var16 = p_Var16->next;
  }
  pxVar9 = pxVar9->next;
  goto LAB_00195504;
LAB_00195677:
  pxVar36 = type->facets;
  pxVar24 = pxVar40;
  pxVar40 = pctxt;
  pxVar41 = type;
  if (pxVar36 != (xmlSchemaFacetPtr)0x0) {
    bVar33 = false;
    pxVar24 = pctxt;
    do {
      while ((pxVar36->type & ~XML_SCHEMA_TYPE_BASIC) != XML_SCHEMA_FACET_PATTERN) {
        xmlSchemaPIllegalFacetListUnionErr(pctxt,XML_SCHEMAP_COS_ST_RESTRICTS_3_3_2_4,type,pxVar36);
        pxVar36 = pxVar36->next;
        bVar33 = true;
        if (pxVar36 == (_xmlSchemaFacet *)0x0) goto LAB_0019400a;
      }
      pxVar36 = pxVar36->next;
    } while (pxVar36 != (_xmlSchemaFacet *)0x0);
LAB_0019589b:
    pctxt = pxVar24;
    pxVar40 = pxVar24;
    pxVar41 = type;
    if (bVar33) goto LAB_0019400a;
  }
  goto LAB_001942ca;
}

Assistant:

static int
xmlSchemaFixupSimpleTypeStageTwo(xmlSchemaParserCtxtPtr pctxt,
				 xmlSchemaTypePtr type)
{
    int res, olderrs = pctxt->nberrors;

    if (type->type != XML_SCHEMA_TYPE_SIMPLE)
	return(-1);

    if (! WXS_IS_TYPE_NOT_FIXED(type))
	return(0);

    type->flags |= XML_SCHEMAS_TYPE_INTERNAL_RESOLVED;
    type->contentType = XML_SCHEMA_CONTENT_SIMPLE;

    if (type->baseType == NULL) {
	PERROR_INT("xmlSchemaFixupSimpleTypeStageTwo",
	    "missing baseType");
	goto exit_failure;
    }
    if (WXS_IS_TYPE_NOT_FIXED(type->baseType))
	xmlSchemaTypeFixup(type->baseType, ACTXT_CAST pctxt);
    /*
    * If a member type of a union is a union itself, we need to substitute
    * that member type for its member types.
    * NOTE that this might change in WXS 1.1; i.e. we will keep the union
    * types in WXS 1.1.
    */
    if ((type->memberTypes != NULL) &&
	(xmlSchemaFinishMemberTypeDefinitionsProperty(pctxt, type) == -1))
	return(-1);
    /*
    * SPEC src-simple-type 1
    * "The corresponding simple type definition, if any, must satisfy
    * the conditions set out in Constraints on Simple Type Definition
    * Schema Components ($3.14.6)."
    */
    /*
    * Schema Component Constraint: Simple Type Definition Properties Correct
    * (st-props-correct)
    */
    res = xmlSchemaCheckSTPropsCorrect(pctxt, type);
    HFAILURE HERROR
    /*
    * Schema Component Constraint: Derivation Valid (Restriction, Simple)
    * (cos-st-restricts)
    */
    res = xmlSchemaCheckCOSSTRestricts(pctxt, type);
    HFAILURE HERROR
    /*
    * TODO: Removed the error report, since it got annoying to get an
    * extra error report, if anything failed until now.
    * Enable this if needed.
    *
    * xmlSchemaPErr(ctxt, type->node,
    *    XML_SCHEMAP_SRC_SIMPLE_TYPE_1,
    *    "Simple type '%s' does not satisfy the constraints "
    *    "on simple type definitions.\n",
    *    type->name, NULL);
    */
    /*
    * Schema Component Constraint: Simple Type Restriction (Facets)
    * (st-restrict-facets)
    */
    res = xmlSchemaCheckFacetValues(type, pctxt);
    HFAILURE HERROR
    if ((type->facetSet != NULL) ||
	(type->baseType->facetSet != NULL)) {
	res = xmlSchemaDeriveAndValidateFacets(pctxt, type);
	HFAILURE HERROR
    }
    /*
    * Whitespace value.
    */
    res = xmlSchemaTypeFixupWhitespace(type);
    HFAILURE HERROR
    xmlSchemaTypeFixupOptimFacets(type);

exit_error:
    if (olderrs != pctxt->nberrors)
	return(pctxt->err);
    return(0);

exit_failure:
    return(-1);
}